

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O2

uint64_t compute_cdef_dist_highbd
                   (void *dst,int dstride,uint16_t *src,cdef_list *dlist,int cdef_count,
                   BLOCK_SIZE bsize,int coeff_shift,int row,int col)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  ulong uVar5;
  uint64_t uVar6;
  ulong uVar7;
  undefined7 in_register_00000089;
  ulong uVar8;
  
  uVar5 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  uVar1 = block_size_wide[uVar5];
  uVar2 = block_size_high[uVar5];
  uVar3 = ""[uVar5];
  uVar4 = ""[uVar5];
  uVar7 = 0;
  uVar5 = (ulong)(uint)cdef_count;
  if (cdef_count < 1) {
    uVar5 = uVar7;
  }
  uVar8 = 0;
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    uVar6 = (*aom_mse_wxh_16bit_highbd)
                      ((uint16_t *)
                       ((long)(row * dstride + col) * 2 + (long)dst * 2 +
                       (long)(int)(((uint)dlist[uVar7].bx << (uVar3 + 2 & 0x1f)) +
                                  ((uint)dlist[uVar7].by << (uVar4 + 2 & 0x1f)) * dstride) * 2),
                       dstride,src + ((int)uVar7 << (uVar4 + uVar3 + 4 & 0x1f)),(int)uVar1,
                       (int)uVar1,(int)uVar2);
    uVar8 = uVar8 + uVar6;
  }
  return uVar8 >> ((char)coeff_shift * '\x02' & 0x3fU);
}

Assistant:

static uint64_t compute_cdef_dist_highbd(void *dst, int dstride, uint16_t *src,
                                         cdef_list *dlist, int cdef_count,
                                         BLOCK_SIZE bsize, int coeff_shift,
                                         int row, int col) {
  assert(bsize == BLOCK_4X4 || bsize == BLOCK_4X8 || bsize == BLOCK_8X4 ||
         bsize == BLOCK_8X8);
  uint64_t sum = 0;
  int bi, bx, by;
  uint16_t *dst16 = CONVERT_TO_SHORTPTR((uint8_t *)dst);
  uint16_t *dst_buff = &dst16[row * dstride + col];
  int src_stride, width, height, width_log2, height_log2;
  init_src_params(&src_stride, &width, &height, &width_log2, &height_log2,
                  bsize);
  for (bi = 0; bi < cdef_count; bi++) {
    by = dlist[bi].by;
    bx = dlist[bi].bx;
    sum += aom_mse_wxh_16bit_highbd(
        &dst_buff[(by << height_log2) * dstride + (bx << width_log2)], dstride,
        &src[bi << (height_log2 + width_log2)], src_stride, width, height);
  }
  return sum >> 2 * coeff_shift;
}